

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall Fluid::reset_grid(Fluid *this)

{
  Program *this_00;
  
  (*glad_glMemoryBarrier)(0xffffffff);
  this_00 = &this->reset_grid_program;
  gfx::Program::use(this_00);
  set_common_uniforms(this,this_00);
  (*glad_glValidateProgram)((this->reset_grid_program).id);
  gfx::Program::check_validation(this_00,(this->reset_grid_program).id);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void reset_grid() {
        ssbo_barrier();
        reset_grid_program.use();
        set_common_uniforms(reset_grid_program);
        reset_grid_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        reset_grid_program.disuse();
    }